

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstract.h
# Opt level: O2

void __thiscall Abstract<4U>::Abstract(Abstract<4U> *this)

{
  this->_vptr_Abstract = (_func_int **)&PTR_Init_00112b68;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->sep)._M_dataplus._M_p = (pointer)&(this->sep).field_2;
  (this->sep)._M_string_length = 0;
  (this->sep).field_2._M_local_buf[0] = '\0';
  this->pr = 0.0;
  this->cr = 0.0;
  this->aae = 0.0;
  this->are = 0.0;
  return;
}

Assistant:

Abstract() { pr = cr = are = aae = 0; }